

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TicsSpecsBaseOf.hpp
# Opt level: O3

string * __thiscall
sciplot::TicsSpecsBaseOf<sciplot::TicsSpecs>::repr
          (string *__return_storage_ptr__,TicsSpecsBaseOf<sciplot::TicsSpecs> *this,string *axis)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostream *poVar2;
  bool bVar3;
  long lVar4;
  int iVar5;
  long *plVar6;
  ostream *poVar7;
  size_type *psVar8;
  string show;
  stringstream ss;
  string local_238;
  string local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  long *local_1d8 [2];
  long local_1c8 [2];
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [7];
  ios_base local_138 [264];
  
  bVar3 = (this->super_ShowSpecsOf<sciplot::TicsSpecs>).m_show;
  iVar5 = 0x17b425;
  if (bVar3 == false) {
    iVar5 = 0x18c142;
  }
  local_1d8[0] = local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,iVar5,iVar5 + (bVar3 ^ 1) * 2)
  ;
  iVar5 = std::__cxx11::string::compare((char *)local_1d8);
  if (iVar5 == 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                   "unset ",axis);
    plVar6 = (long *)std::__cxx11::string::append(local_1b8);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar8 = (size_type *)(plVar6 + 2);
    if ((size_type *)*plVar6 == psVar8) {
      lVar4 = plVar6[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar4;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
    }
    __return_storage_ptr__->_M_string_length = plVar6[1];
    *plVar6 = (long)psVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
      operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity + 1);
    }
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::operator+(&local_1f8,"set ",axis);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_1f8);
    poVar2 = (ostream *)(local_1b8 + 0x10);
    paVar1 = &local_238.field_2;
    psVar8 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_238.field_2._M_allocated_capacity = *psVar8;
      local_238.field_2._8_8_ = plVar6[3];
      local_238._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_238.field_2._M_allocated_capacity = *psVar8;
      local_238._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_238._M_string_length = plVar6[1];
    *plVar6 = (long)psVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,local_238._M_dataplus._M_p,local_238._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != paVar1) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(this->m_along)._M_dataplus._M_p,(this->m_along)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(this->m_mirror)._M_dataplus._M_p,(this->m_mirror)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(this->m_inout)._M_dataplus._M_p,(this->m_inout)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"scale ",6);
    poVar7 = std::ostream::_M_insert<double>(this->m_scalemajor);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,",",1);
    poVar7 = std::ostream::_M_insert<double>(this->m_scaleminor);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(this->m_rotate)._M_dataplus._M_p,(this->m_rotate)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    OffsetSpecsOf<sciplot::TicsSpecs>::repr_abi_cxx11_
              (&local_238,&this->super_OffsetSpecsOf<sciplot::TicsSpecs>);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,local_238._M_dataplus._M_p,local_238._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != paVar1) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    TextSpecsOf<sciplot::TicsSpecs>::repr_abi_cxx11_
              (&local_238,&this->super_TextSpecsOf<sciplot::TicsSpecs>);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,local_238._M_dataplus._M_p,local_238._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != paVar1) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,(this->m_format)._M_dataplus._M_p,(this->m_format)._M_string_length);
    std::__cxx11::stringbuf::str();
    internal::removeExtraWhitespaces(__return_storage_ptr__,&local_218);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if (local_1d8[0] != local_1c8) {
    operator_delete(local_1d8[0],local_1c8[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

auto TicsSpecsBaseOf<DerivedSpecs>::repr(std::string axis) const -> std::string
{
    const auto show = ShowSpecsOf<DerivedSpecs>::repr();
    if(show == "no")
        return "unset " + axis + "tics";

    std::stringstream ss;
    ss << "set " + axis + "tics" << " ";
    ss << m_along << " ";
    ss << m_mirror << " ";
    ss << m_inout << " ";
    ss << "scale " << m_scalemajor << "," << m_scaleminor << " ";
    ss << m_rotate << " ";
    ss << OffsetSpecsOf<DerivedSpecs>::repr() << " ";
    ss << TextSpecsOf<DerivedSpecs>::repr() << " ";
    ss << m_format;
    return internal::removeExtraWhitespaces(ss.str());
}